

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void dataDeviceHandleSelection(void *userData,wl_data_device *device,wl_data_offer *offer)

{
  GLFWbool GVar1;
  wl_data_offer *pwVar2;
  _GLFWofferWayland *p_Var3;
  _GLFWofferWayland *p_Var4;
  uint local_24;
  uint i;
  wl_data_offer *offer_local;
  wl_data_device *device_local;
  void *userData_local;
  
  if (_glfw.wl.selectionOffer != (wl_data_offer *)0x0) {
    wl_data_offer_destroy(_glfw.wl.selectionOffer);
    _glfw.wl.selectionOffer = (wl_data_offer *)0x0;
  }
  local_24 = 0;
  while( true ) {
    if (_glfw.wl.offerCount <= local_24) {
      return;
    }
    if (_glfw.wl.offers[local_24].offer == offer) break;
    local_24 = local_24 + 1;
  }
  pwVar2 = offer;
  if (_glfw.wl.offers[local_24].text_plain_utf8 == 0) {
    wl_data_offer_destroy(offer);
    pwVar2 = _glfw.wl.selectionOffer;
  }
  _glfw.wl.selectionOffer = pwVar2;
  p_Var3 = _glfw.wl.offers + local_24;
  p_Var4 = _glfw.wl.offers + (_glfw.wl.offerCount - 1);
  p_Var3->offer = p_Var4->offer;
  GVar1 = p_Var4->text_uri_list;
  p_Var3->text_plain_utf8 = p_Var4->text_plain_utf8;
  p_Var3->text_uri_list = GVar1;
  _glfw.wl.offerCount = _glfw.wl.offerCount - 1;
  return;
}

Assistant:

static void dataDeviceHandleSelection(void* userData,
                                      struct wl_data_device* device,
                                      struct wl_data_offer* offer)
{
    if (_glfw.wl.selectionOffer)
    {
        wl_data_offer_destroy(_glfw.wl.selectionOffer);
        _glfw.wl.selectionOffer = NULL;
    }

    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            if (_glfw.wl.offers[i].text_plain_utf8)
                _glfw.wl.selectionOffer = offer;
            else
                wl_data_offer_destroy(offer);

            _glfw.wl.offers[i] = _glfw.wl.offers[_glfw.wl.offerCount - 1];
            _glfw.wl.offerCount--;
            break;
        }
    }
}